

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O2

bool __thiscall zmq::ypipe_t<zmq::msg_t,_256>::unwrite(ypipe_t<zmq::msg_t,_256> *this,msg_t *value_)

{
  size_t *psVar1;
  undefined8 *puVar2;
  int iVar3;
  msg_t *pmVar4;
  chunk_t *pcVar5;
  metadata_t *pmVar6;
  content_t *pcVar7;
  size_t sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  msg_t *pmVar13;
  
  pmVar4 = this->_f;
  pmVar13 = ((this->_queue)._back_chunk)->values + (this->_queue)._back_pos;
  if (pmVar4 != pmVar13) {
    yqueue_t<zmq::msg_t,_256>::unpush(&this->_queue);
    pcVar5 = (this->_queue)._back_chunk;
    iVar3 = (this->_queue)._back_pos;
    pmVar6 = pcVar5->values[iVar3]._u.base.metadata;
    pcVar7 = pcVar5->values[iVar3]._u.lmsg.content;
    psVar1 = &pcVar5->values[iVar3]._u.cmsg.size;
    sVar8 = *psVar1;
    uVar9 = psVar1[1];
    puVar2 = (undefined8 *)((long)&pcVar5->values[iVar3]._u + 0x20);
    uVar10 = *puVar2;
    uVar11 = puVar2[1];
    puVar2 = (undefined8 *)((long)&pcVar5->values[iVar3]._u + 0x30);
    uVar12 = puVar2[1];
    *(undefined8 *)((long)&value_->_u + 0x30) = *puVar2;
    *(undefined8 *)((long)&value_->_u + 0x38) = uVar12;
    *(undefined8 *)((long)&value_->_u + 0x20) = uVar10;
    *(undefined8 *)((long)&value_->_u + 0x28) = uVar11;
    (value_->_u).cmsg.size = sVar8;
    *(undefined8 *)((long)&value_->_u + 0x18) = uVar9;
    (value_->_u).base.metadata = pmVar6;
    (value_->_u).lmsg.content = pcVar7;
  }
  return pmVar4 != pmVar13;
}

Assistant:

bool unwrite (T *value_)
    {
        if (_f == &_queue.back ())
            return false;
        _queue.unpush ();
        *value_ = _queue.back ();
        return true;
    }